

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O3

optional_idx
duckdb::TraverseInternal<duckdb::Node_const>
          (ART *art,reference<const_duckdb::Node> *node,ARTKey *key,idx_t *depth,bool is_mutable)

{
  optional_idx oVar1;
  Node *node_00;
  Prefix prefix;
  Prefix PStack_48;
  
  node_00 = node->_M_data;
  while( true ) {
    if (((node_00->super_IndexPointer).data & 0x7f00000000000000) != 0x100000000000000) {
      return (optional_idx)0xffffffffffffffff;
    }
    oVar1 = Prefix::GetMismatchWithKey(art,node_00,key,depth);
    if (oVar1.index != 0xffffffffffffffff) break;
    Prefix::Prefix(&PStack_48,art,(Node)(node->_M_data->super_IndexPointer).data,is_mutable,false);
    node->_M_data = PStack_48.ptr;
    node_00 = PStack_48.ptr;
    if ((long)((PStack_48.ptr)->super_IndexPointer).data < 0) {
      return (optional_idx)0xffffffffffffffff;
    }
  }
  return (optional_idx)oVar1.index;
}

Assistant:

optional_idx TraverseInternal(ART &art, reference<NODE> &node, const ARTKey &key, idx_t &depth,
                              const bool is_mutable = false) {
	D_ASSERT(node.get().HasMetadata());
	D_ASSERT(node.get().GetType() == NType::PREFIX);

	while (node.get().GetType() == NType::PREFIX) {
		auto pos = Prefix::GetMismatchWithKey(art, node, key, depth);
		if (pos.IsValid()) {
			return pos;
		}

		Prefix prefix(art, node, is_mutable);
		node = *prefix.ptr;
		if (node.get().GetGateStatus() == GateStatus::GATE_SET) {
			break;
		}
	}

	// We return an invalid index, if (and only if) the next node is:
	// 1. not a prefix, or
	// 2. a gate.
	return optional_idx::Invalid();
}